

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateStaticInitializer
          (FileGenerator *this,Printer *p)

{
  TypeErasedState *pTVar1;
  TypeErasedState *pTVar2;
  vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
  *pvVar3;
  Printer *pPVar4;
  long *plVar5;
  long lVar6;
  TypeErasedState *pTVar7;
  int priority;
  long alStack_258 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_238;
  undefined8 uStack_210;
  anon_class_1_0_00000001 local_205;
  int local_204;
  vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
  *local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [24];
  Printer *local_1d0;
  string local_1c8;
  FileGenerator *local_1a8;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_204 = 0;
  local_200 = this->static_initializers_;
  local_1e8._16_8_ = 0x20;
  local_1d0 = p;
  local_1a8 = this;
  do {
    pPVar4 = local_1d0;
    local_204 = local_204 + 1;
    if ((local_200->
        super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (local_200->
        super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      uStack_210 = 0x1c3840;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"priority","");
      uStack_210 = 0x1c3852;
      io::Printer::Sub::Sub<int&>(&local_1a0,&local_1c8,&local_204);
      uStack_210 = 0x1c387c;
      local_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"expr","");
      pvVar3 = local_200;
      if (local_1f8 == local_1e8) {
        uStack_d0 = local_1e8._8_8_;
        local_e8 = &local_d8;
      }
      else {
        local_e8 = local_1f8;
      }
      _local_d8 = CONCAT71(local_1e8._1_7_,local_1e8[0]);
      local_e0 = local_1f0;
      local_1f0 = 0;
      local_1e8[0] = 0;
      uStack_210 = 0x1c38dd;
      local_1f8 = local_1e8;
      local_c8 = (undefined8 *)operator_new(0x18);
      *local_c8 = pvVar3;
      local_c8[1] = &local_1d0;
      *(undefined1 *)(local_c8 + 2) = 0;
      local_b0 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
      uStack_c0 = 0;
      local_b8 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
      local_a8 = 1;
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = 0;
      local_80 = 0;
      uStack_210 = 0x1c397a;
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x36a4ec);
      local_38 = 0;
      uStack_210 = 0x1c39a0;
      google::protobuf::io::Printer::Emit
                (pPVar4,&local_1a0,2,0xc0,
                 "\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY$priority$ static ::std::false_type\n              _static_init$priority$_ PROTOBUF_UNUSED =\n                  ($expr$, ::std::false_type{});\n        "
                );
      lVar6 = 0x170;
      do {
        if (*(char *)((long)&local_1a8 + lVar6) == '\x01') {
          uStack_210 = 0x1c39bb;
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_1e8 + lVar6));
        }
        if ((long *)((long)&local_200 + lVar6) != *(long **)((long)&uStack_210 + lVar6)) {
          uStack_210 = 0x1c39d7;
          operator_delete(*(long **)((long)&uStack_210 + lVar6),
                          *(long *)((long)&local_200 + lVar6) + 1);
        }
        uStack_210 = 0x1c39ea;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr
          [*(byte *)((long)&vStack_238.
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    + lVar6 + 0x20)]._M_data)
                  (&local_205,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)((long)&vStack_238.
                              super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                              .
                              super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      + lVar6));
        plVar5 = (long *)((long)alStack_258 + lVar6 + 0x10);
        *(undefined1 *)
         ((long)&vStack_238.
                 super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                 .
                 super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                 .
                 super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                 .super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
                 super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> +
         lVar6 + 0x20) = 0xff;
        if (plVar5 != *(long **)((long)alStack_258 + lVar6)) {
          uStack_210 = 0x1c3a0a;
          operator_delete(*(long **)((long)alStack_258 + lVar6),*plVar5 + 1);
        }
        lVar6 = lVar6 + -0xb8;
      } while (lVar6 != 0);
      if (local_1f8 != local_1e8) {
        uStack_210 = 0x1c3a2a;
        operator_delete(local_1f8,CONCAT71(local_1e8._1_7_,local_1e8[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        uStack_210 = 0x1c3a46;
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      pTVar1 = (TypeErasedState *)
               (pvVar3->
               super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (TypeErasedState *)
               (pvVar3->
               super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pTVar7 = pTVar1;
      if (pTVar2 != pTVar1) {
        do {
          uStack_210 = 0x1c3a6d;
          (**(code **)(pTVar7 + 1))(dispose,pTVar7,pTVar7);
          pTVar7 = pTVar7 + 2;
        } while (pTVar7 != pTVar2);
        (local_200->
        super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)pTVar1;
      }
    }
    local_200 = (vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
                 *)((long)local_1a8->static_initializers_ + local_1e8._16_8_ + -8);
    local_1e8._16_8_ = local_1e8._16_8_ + 0x18;
  } while (local_1e8._16_8_ != 0x50);
  return;
}

Assistant:

void FileGenerator::GenerateStaticInitializer(io::Printer* p) {
  int priority = 0;
  for (auto& inits : static_initializers_) {
    ++priority;
    if (inits.empty()) continue;
    p->Emit(
        {{"priority", priority},
         {"expr",
          [&] {
            for (auto& init : inits) {
              init(p);
            }
          }}},
        R"cc(
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY$priority$ static ::std::false_type
              _static_init$priority$_ PROTOBUF_UNUSED =
                  ($expr$, ::std::false_type{});
        )cc");
    // Reset the vector because we might be generating many files.
    inits.clear();
  }
}